

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_get_extver(char *extname,int *version)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  int local_34;
  int i;
  char *p2;
  NGP_EXTVER_TAB *p;
  int *version_local;
  char *extname_local;
  
  if ((extname == (char *)0x0) || (version == (int *)0x0)) {
    extname_local._4_4_ = 0x170;
  }
  else if ((ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) && (0 < ngp_extver_tab_size)) {
    extname_local._4_4_ = 0x170;
  }
  else if ((ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) || (0 < ngp_extver_tab_size)) {
    for (local_34 = 0; local_34 < ngp_extver_tab_size; local_34 = local_34 + 1) {
      iVar1 = strcmp(extname,ngp_extver_tab[local_34].extname);
      if (iVar1 == 0) {
        iVar1 = ngp_extver_tab[local_34].version + 1;
        ngp_extver_tab[local_34].version = iVar1;
        *version = iVar1;
        return 0;
      }
    }
    if (ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) {
      p2 = (char *)malloc(0x10);
    }
    else {
      p2 = (char *)realloc(ngp_extver_tab,(long)(ngp_extver_tab_size + 1) << 4);
    }
    if (p2 == (char *)0x0) {
      extname_local._4_4_ = 0x168;
    }
    else {
      sVar2 = strlen(extname);
      __dest = (char *)malloc(sVar2 + 1);
      if (__dest == (char *)0x0) {
        free(p2);
        extname_local._4_4_ = 0x168;
      }
      else {
        strcpy(__dest,extname);
        ngp_extver_tab = (NGP_EXTVER_TAB *)p2;
        *(char **)(p2 + (long)ngp_extver_tab_size * 0x10) = __dest;
        ngp_extver_tab[ngp_extver_tab_size].version = 1;
        *version = 1;
        ngp_extver_tab_size = ngp_extver_tab_size + 1;
        extname_local._4_4_ = 0;
      }
    }
  }
  else {
    extname_local._4_4_ = 0x170;
  }
  return extname_local._4_4_;
}

Assistant:

int	ngp_get_extver(char *extname, int *version)
 { NGP_EXTVER_TAB *p;
   char 	*p2;
   int		i;

   if ((NULL == extname) || (NULL == version)) return(NGP_BAD_ARG);
   if ((NULL == ngp_extver_tab) && (ngp_extver_tab_size > 0)) return(NGP_BAD_ARG);
   if ((NULL != ngp_extver_tab) && (ngp_extver_tab_size <= 0)) return(NGP_BAD_ARG);

   for (i=0; i<ngp_extver_tab_size; i++)
    { if (0 == strcmp(extname, ngp_extver_tab[i].extname))
        { *version = (++ngp_extver_tab[i].version);
          return(NGP_OK);
        }
    }

   if (NULL == ngp_extver_tab)
     { p = (NGP_EXTVER_TAB *)ngp_alloc(sizeof(NGP_EXTVER_TAB)); }
   else
     { p = (NGP_EXTVER_TAB *)ngp_realloc(ngp_extver_tab, (ngp_extver_tab_size + 1) * sizeof(NGP_EXTVER_TAB)); }

   if (NULL == p) return(NGP_NO_MEMORY);

   p2 = ngp_alloc(strlen(extname) + 1);
   if (NULL == p2)
     { ngp_free(p);
       return(NGP_NO_MEMORY);
     }

   strcpy(p2, extname);
   ngp_extver_tab = p;
   ngp_extver_tab[ngp_extver_tab_size].extname = p2;
   *version = ngp_extver_tab[ngp_extver_tab_size].version = 1;

   ngp_extver_tab_size++;

   return(NGP_OK);
 }